

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O0

bool AString_replaceCString
               (AString *str,char *old,size_t oldLen,char *rep,size_t newLen,size_t count)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  void *__dest;
  size_t count_00;
  char c;
  char *tmp;
  size_t tmpCapacity;
  size_t tmpSize;
  size_t currentOldIndex;
  size_t i;
  size_t count_local;
  size_t newLen_local;
  char *rep_local;
  size_t oldLen_local;
  char *old_local;
  AString *str_local;
  
  tmpSize = 0;
  if (((str == (AString *)0x0) || (old == (char *)0x0)) || (oldLen == 0)) {
    str_local._4_4_ = false;
  }
  else {
    count_local = newLen;
    newLen_local = (size_t)rep;
    if (rep == (char *)0x0) {
      newLen_local = (long)"Results for all suites run:\n" + 0x1c;
      count_local = 0;
    }
    sVar1 = str->size;
    sVar2 = str->capacity;
    __dest = malloc(sVar2 + 1);
    memcpy(__dest,str->buffer,sVar1 + 1);
    i = count;
    for (currentOldIndex = 0; currentOldIndex < str->size; currentOldIndex = currentOldIndex + 1) {
      if (str->buffer[currentOldIndex] == old[tmpSize]) {
        count_00 = tmpSize + 1;
        if (count_00 == oldLen) {
          currentOldIndex = currentOldIndex - tmpSize;
          bVar3 = AString_replaceRangeCString
                            (str,currentOldIndex,count_00,(char *)newLen_local,count_local);
          if (bVar3 == false) {
            str->capacity = sVar2;
            str->size = sVar1;
            memcpy(str->buffer,__dest,sVar1 + 1);
            free(__dest);
            return false;
          }
          if ((i != 0) && (i = i - 1, i == 0)) break;
          tmpSize = 0;
          count_00 = tmpSize;
        }
      }
      else {
        tmpSize = 0;
        count_00 = tmpSize;
      }
      tmpSize = count_00;
    }
    free(__dest);
    str_local._4_4_ = true;
  }
  return str_local._4_4_;
}

Assistant:

ACUTILS_HD_FUNC bool AString_replaceCString(struct AString *str, const char *old, size_t oldLen, const char *rep, size_t newLen, size_t count)
{
    size_t i, currentOldIndex = 0, tmpSize, tmpCapacity;
    char *tmp;
    if(str == nullptr || old == nullptr || oldLen == 0) {
        return false;
    } else if(rep == nullptr) {
        rep = "";
        newLen = 0;
    }
    tmpSize = str->size;
    tmpCapacity = str->capacity;
    tmp = (char*) malloc(tmpCapacity + 1);
    memcpy(tmp, str->buffer, tmpSize + 1);
    for(i = 0; i < str->size; ++i) {
        char c = str->buffer[i];
        if(c == old[currentOldIndex]) {
            if(++currentOldIndex == oldLen) {
                i -= currentOldIndex - 1;
                if(!AString_replaceRangeCString(str, i, currentOldIndex, rep, newLen)) {
                    str->capacity = tmpCapacity;
                    str->size = tmpSize;
                    memcpy(str->buffer, tmp, tmpSize + 1);
                    free(tmp);
                    return false;
                }
                if(count > 0 && --count == 0)
                    goto RETURN;
                currentOldIndex = 0;
            }
        } else {
            currentOldIndex = 0;
        }
    }
    RETURN:
    free(tmp);
    return true;
}